

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  int *piVar4;
  slot_type *psVar5;
  undefined1 uVar6;
  undefined8 extraout_RAX_00;
  undefined8 uVar7;
  slot_type *psVar8;
  undefined8 extraout_RAX;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       psVar1 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 == (slot_type *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
         psVar2 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar2)) {
      if (psVar1 == (slot_type *)
                    absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
          psVar2 == (slot_type *)
                    absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_00215aeb:
        return psVar1 == psVar2;
      }
      if ((psVar1 ==
          (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) !=
          (psVar2 ==
          (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>))
      goto LAB_00215b07;
      if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_00215aeb;
      if ((psVar2 == (slot_type *)&kSooControl) == (psVar1 == (slot_type *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar3 = (b->field_1).slot_;
        if (psVar1 == (slot_type *)&kSooControl) {
          if ((slot_type *)a == psVar3) goto LAB_00215aeb;
        }
        else {
          psVar8 = psVar3;
          psVar5 = psVar2;
          b = (iterator *)(slot_type *)a;
          if (psVar2 < psVar1) {
            psVar8 = (slot_type *)a;
            psVar5 = psVar1;
            b = (iterator *)psVar3;
          }
          if ((psVar5 < b) && (b <= psVar8)) goto LAB_00215aeb;
        }
      }
      operator==();
      goto LAB_00215afd;
    }
  }
  else {
LAB_00215afd:
    operator==();
  }
  operator==();
LAB_00215b07:
  operator==();
  uVar6 = (undefined1)extraout_RAX;
  uVar7 = extraout_RAX;
  for (; a != b; a = (iterator *)&(((value_type *)a)->first)._M_string_length) {
    piVar4 = *(int **)a;
    if (piVar4 != (int *)0x0) {
      operator_delete(piVar4,(long)*piVar4 + 8);
      uVar7 = extraout_RAX_00;
    }
    uVar6 = (undefined1)uVar7;
    (((value_type *)a)->first)._M_dataplus._M_p = (ctrl_t *)0x0;
  }
  return (bool)uVar6;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }